

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

StringCache * stringcache_create(MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  void *pvVar1;
  StringCache *cache;
  size_t tablelen;
  uint32 initial_table_size;
  void *d_local;
  MOJOSHADER_free f_local;
  MOJOSHADER_malloc m_local;
  
  m_local = (MOJOSHADER_malloc)(*m)(0x28,d);
  if (m_local == (MOJOSHADER_malloc)0x0) {
    m_local = (MOJOSHADER_malloc)0x0;
  }
  else {
    memset(m_local,0,0x28);
    pvVar1 = (*m)(0x800,d);
    *(void **)m_local = pvVar1;
    if (*(long *)m_local == 0) {
      (*f)(m_local,d);
      m_local = (MOJOSHADER_malloc)0x0;
    }
    else {
      memset(*(void **)m_local,0,0x800);
      *(undefined4 *)(m_local + 8) = 0x100;
      *(MOJOSHADER_malloc *)(m_local + 0x10) = m;
      *(MOJOSHADER_free *)(m_local + 0x18) = f;
      *(void **)(m_local + 0x20) = d;
    }
  }
  return (StringCache *)m_local;
}

Assistant:

StringCache *stringcache_create(MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    const uint32 initial_table_size = 256;
    const size_t tablelen = sizeof (StringBucket *) * initial_table_size;
    StringCache *cache = (StringCache *) m(sizeof (StringCache), d);
    if (!cache)
        return NULL;
    memset(cache, '\0', sizeof (StringCache));

    cache->hashtable = (StringBucket **) m(tablelen, d);
    if (!cache->hashtable)
    {
        f(cache, d);
        return NULL;
    } // if
    memset(cache->hashtable, '\0', tablelen);

    cache->table_size = initial_table_size;
    cache->m = m;
    cache->f = f;
    cache->d = d;
    return cache;
}